

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

buffer_appender<char>
fmt::v7::detail::format_uint<1u,char,fmt::v7::detail::buffer_appender<char>,unsigned__int128>
          (buffer_appender<char> out,unsigned___int128 value,int num_digits,bool upper)

{
  undefined1 value_00 [16];
  undefined1 value_01 [16];
  char *buffer_00;
  int in_ECX;
  bool in_DL;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> in_RSI;
  buffer<char> *in_RDI;
  char buffer [129];
  char *ptr;
  char *in_stack_fffffffffffffee8;
  undefined8 in_stack_fffffffffffffef0;
  size_t in_stack_ffffffffffffff00;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> in_stack_ffffffffffffff08;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_8;
  
  to_unsigned<int>(in_ECX);
  buffer_00 = to_pointer<char>((buffer_appender<char>)in_stack_ffffffffffffff08.container,
                               in_stack_ffffffffffffff00);
  if (buffer_00 == (char *)0x0) {
    value_01._8_8_ = in_stack_fffffffffffffef0;
    value_01._0_8_ = in_stack_fffffffffffffee8;
    format_uint<1u,char,unsigned__int128>
              (&stack0xffffffffffffff08,(unsigned___int128)value_01,(int)in_RSI.container,in_DL);
    local_8.container =
         (buffer<char> *)
         copy_str<char,_char_*,_fmt::v7::detail::buffer_appender<char>,_0>
                   (in_RDI,in_stack_fffffffffffffee8,in_RSI.container);
  }
  else {
    value_00._8_8_ = in_stack_fffffffffffffef0;
    value_00._0_8_ = in_stack_fffffffffffffee8;
    format_uint<1u,char,unsigned__int128>
              (buffer_00,(unsigned___int128)value_00,(int)in_RSI.container,in_DL);
    local_8.container = in_RDI;
  }
  return (buffer_appender<char>)
         (back_insert_iterator<fmt::v7::detail::buffer<char>_>)local_8.container;
}

Assistant:

inline It format_uint(It out, UInt value, int num_digits, bool upper = false) {
  if (auto ptr = to_pointer<Char>(out, to_unsigned(num_digits))) {
    format_uint<BASE_BITS>(ptr, value, num_digits, upper);
    return out;
  }
  // Buffer should be large enough to hold all digits (digits / BASE_BITS + 1).
  char buffer[num_bits<UInt>() / BASE_BITS + 1];
  format_uint<BASE_BITS>(buffer, value, num_digits, upper);
  return detail::copy_str<Char>(buffer, buffer + num_digits, out);
}